

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

void __thiscall crnd::crn_unpacker::crn_unpacker(crn_unpacker *this)

{
  undefined8 *puVar1;
  long lVar2;
  
  this->m_magic = 0x1ef9cabd;
  this->m_pData = (uint8 *)0x0;
  this->m_data_size = 0;
  (this->m_reference_encoding_dm).m_total_syms = 0;
  (this->m_reference_encoding_dm).m_code_sizes.m_p = (uchar *)0x0;
  (this->m_reference_encoding_dm).m_code_sizes.m_size = 0;
  (this->m_reference_encoding_dm).m_code_sizes.m_capacity = 0;
  (this->m_reference_encoding_dm).m_code_sizes.m_alloc_failed = false;
  (this->m_reference_encoding_dm).m_pDecode_tables = (decoder_tables *)0x0;
  this->m_pHeader = (crn_header *)0x0;
  (this->m_codec).m_pDecode_buf = (uint8 *)0x0;
  (this->m_codec).m_pDecode_buf_next = (uint8 *)0x0;
  (this->m_codec).m_pDecode_buf_end = (uint8 *)0x0;
  *(undefined8 *)((long)&(this->m_codec).m_pDecode_buf_end + 4) = 0;
  (this->m_codec).m_bit_buf = 0;
  (this->m_codec).m_bit_count = 0;
  lVar2 = 0;
  do {
    *(undefined4 *)((long)&this->m_endpoint_delta_dm[0].m_total_syms + lVar2) = 0;
    puVar1 = (undefined8 *)((long)&this->m_endpoint_delta_dm[0].m_code_sizes.m_p + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    (&this->m_endpoint_delta_dm[0].m_code_sizes.m_alloc_failed)[lVar2] = false;
    *(undefined8 *)((long)&this->m_endpoint_delta_dm[0].m_pDecode_tables + lVar2) = 0;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0x50);
  lVar2 = 0;
  do {
    *(undefined4 *)((long)&this->m_selector_delta_dm[0].m_total_syms + lVar2) = 0;
    puVar1 = (undefined8 *)((long)&this->m_selector_delta_dm[0].m_code_sizes.m_p + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    (&this->m_selector_delta_dm[0].m_code_sizes.m_alloc_failed)[lVar2] = false;
    *(undefined8 *)((long)&this->m_selector_delta_dm[0].m_pDecode_tables + lVar2) = 0;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0x50);
  (this->m_color_endpoints).m_p = (uint *)0x0;
  (this->m_color_endpoints).m_size = 0;
  (this->m_color_endpoints).m_capacity = 0;
  (this->m_color_endpoints).m_alloc_failed = false;
  (this->m_color_selectors).m_p = (uint *)0x0;
  (this->m_color_selectors).m_size = 0;
  (this->m_color_selectors).m_capacity = 0;
  (this->m_color_selectors).m_alloc_failed = false;
  (this->m_alpha_endpoints).m_p = (unsigned_short *)0x0;
  (this->m_alpha_endpoints).m_size = 0;
  (this->m_alpha_endpoints).m_capacity = 0;
  (this->m_alpha_endpoints).m_alloc_failed = false;
  (this->m_alpha_selectors).m_p = (unsigned_short *)0x0;
  (this->m_alpha_selectors).m_size = 0;
  (this->m_alpha_selectors).m_capacity = 0;
  (this->m_alpha_selectors).m_alloc_failed = false;
  (this->m_block_buffer).m_p = (block_buffer_element *)0x0;
  (this->m_block_buffer).m_size = 0;
  (this->m_block_buffer).m_capacity = 0;
  (this->m_block_buffer).m_alloc_failed = false;
  return;
}

Assistant:

inline crn_unpacker() :
            m_magic(cMagicValue),
            m_pData(NULL),
            m_data_size(0),
            m_pHeader(NULL)
        {
        }